

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_sse4.c
# Opt level: O3

void av1_get_horver_correlation_full_sse4_1
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  short *psVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long *plVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  float fVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  float fVar31;
  int iVar32;
  int iVar33;
  float fVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  float fVar38;
  undefined1 auVar39 [16];
  int iVar41;
  undefined1 auVar40 [16];
  float fVar42;
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  lVar18 = (long)stride;
  if (height < 4) {
    lVar23 = 0;
    lVar22 = 0;
    lVar25 = 0;
    lVar4 = 0;
  }
  else {
    uVar13 = 0;
    lVar4 = 0;
    lVar25 = 0;
    lVar22 = 0;
    lVar23 = 0;
    plVar15 = (long *)diff;
    do {
      iVar35 = 0;
      iVar36 = 0;
      iVar37 = 0;
      iVar30 = 0;
      iVar32 = 0;
      iVar33 = 0;
      auVar43 = (undefined1  [16])0x0;
      auVar39 = (undefined1  [16])0x0;
      iVar26 = 0;
      iVar28 = 0;
      iVar29 = 0;
      iVar9 = 0;
      iVar5 = 0;
      iVar41 = 0;
      if (3 < width) {
        lVar21 = 0;
        plVar6 = plVar15;
        do {
          lVar10 = *(long *)((long)plVar6 + (long)(stride * 2) * 2);
          auVar46._8_8_ = *plVar6;
          auVar46._0_8_ = lVar10;
          lVar16 = *(long *)((long)plVar6 + lVar18 * 2);
          lVar24 = *(long *)((long)plVar6 + (long)(stride * 3) * 2);
          auVar47._8_8_ = lVar16;
          auVar47._0_8_ = lVar24;
          auVar43._0_8_ = lVar10 << 0x10;
          auVar43._8_8_ = *plVar6 << 0x10;
          auVar48._0_8_ = lVar24 << 0x10;
          auVar48._8_8_ = lVar16 << 0x10;
          auVar45 = pmaddwd(auVar46,auVar43);
          auVar46 = pmaddwd(auVar47,auVar48);
          auVar47 = phaddd(auVar46,auVar45);
          auVar46 = pmaddwd(auVar43,auVar48);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = auVar48._8_8_;
          auVar48 = pmaddwd(auVar43,auVar45);
          auVar48 = phaddd(auVar48,auVar46);
          iVar35 = iVar35 + auVar47._4_4_;
          iVar36 = iVar36 + auVar47._8_4_;
          iVar37 = iVar37 + auVar47._12_4_;
          iVar30 = iVar30 + auVar48._0_4_;
          iVar32 = iVar32 + auVar48._8_4_;
          iVar33 = iVar33 + auVar48._12_4_;
          auVar48 = phaddw(auVar43,auVar43);
          auVar48 = pmovsxwd(auVar48,auVar48);
          auVar46 = pmovsxwd(auVar47,auVar45);
          iVar9 = auVar39._4_4_;
          iVar5 = auVar39._8_4_;
          iVar41 = auVar39._12_4_;
          auVar39._0_4_ = auVar39._0_4_ + auVar46._0_4_ + auVar48._0_4_;
          auVar39._4_4_ = iVar9 + auVar46._4_4_ + auVar48._4_4_;
          auVar39._8_4_ = iVar5 + auVar46._8_4_ + auVar48._8_4_;
          auVar39._12_4_ = iVar41 + auVar46._12_4_ + auVar48._12_4_;
          auVar43 = pmaddwd(auVar43,auVar43);
          auVar48 = pmaddwd(auVar45,auVar45);
          auVar43 = phaddd(auVar43,auVar48);
          iVar26 = iVar26 + auVar43._0_4_;
          iVar28 = iVar28 + auVar43._4_4_;
          iVar29 = iVar29 + auVar43._8_4_;
          lVar21 = lVar21 + 3;
          plVar6 = (long *)((long)plVar6 + 6);
        } while (lVar21 <= width + -4);
        auVar43 = pmovsxdq(auVar43,auVar39);
        auVar40._4_4_ = auVar39._12_4_;
        auVar40._0_4_ = auVar39._8_4_;
        auVar40._8_4_ = auVar39._8_4_;
        auVar40._12_4_ = auVar39._12_4_;
        auVar39 = pmovsxdq(auVar40,auVar40);
        iVar9 = iVar26;
        iVar5 = iVar28;
        iVar41 = iVar29;
      }
      lVar4 = lVar4 + iVar36 + (long)iVar35 + (long)iVar37;
      lVar25 = lVar25 + iVar32 + (long)iVar30 + (long)iVar33;
      lVar22 = lVar22 + auVar43._8_8_ + auVar39._8_8_ + auVar43._0_8_ + auVar39._0_8_;
      lVar23 = lVar23 + iVar5 + (long)iVar9 + (long)iVar41;
      uVar13 = uVar13 + 3;
      plVar15 = (long *)((long)plVar15 + lVar18 * 6);
    } while (uVar13 <= height - 4);
  }
  iVar9 = height % 3;
  if (iVar9 == 1) {
    lVar10 = (long)((height + -1) * stride);
    iVar5 = (int)diff[lVar10];
    lVar21 = (long)iVar5;
    lVar22 = lVar22 + lVar21;
    uVar13 = (ulong)(uint)(iVar5 * iVar5);
    lVar23 = lVar23 + uVar13;
    if (1 < width) {
      uVar19 = 0;
      do {
        sVar2 = diff[lVar10 + uVar19 + 1];
        lVar16 = (long)sVar2;
        lVar4 = lVar4 + diff[lVar10 + uVar19] * lVar16;
        lVar22 = lVar22 + lVar16;
        lVar21 = lVar21 + lVar16;
        uVar11 = (ulong)(uint)((int)sVar2 * (int)sVar2);
        lVar23 = lVar23 + uVar11;
        uVar13 = uVar13 + uVar11;
        uVar19 = uVar19 + 1;
      } while (width - 1 != uVar19);
    }
  }
  else {
    lVar16 = (long)((height + -2) * stride);
    iVar5 = (int)diff[lVar16];
    lVar10 = (long)((height + -1) * stride);
    sVar2 = diff[lVar10];
    lVar21 = (long)sVar2;
    lVar22 = lVar22 + (sVar2 + iVar5);
    uVar20 = (int)sVar2 * (int)sVar2;
    uVar13 = (ulong)uVar20;
    lVar23 = lVar23 + (ulong)(iVar5 * iVar5 + uVar20);
    if (1 < width) {
      uVar19 = 0;
      do {
        iVar5 = (int)diff[lVar16 + uVar19 + 1];
        sVar2 = diff[lVar10 + uVar19 + 1];
        lVar25 = lVar25 + (int)diff[lVar16 + uVar19] * (int)diff[lVar10 + uVar19];
        lVar4 = (long)((int)diff[lVar10 + uVar19] * (int)sVar2) +
                iVar5 * diff[lVar16 + uVar19] + lVar4;
        lVar22 = lVar22 + (sVar2 + iVar5);
        lVar21 = lVar21 + sVar2;
        uVar20 = (int)sVar2 * (int)sVar2;
        lVar23 = lVar23 + (ulong)(iVar5 * iVar5 + uVar20);
        uVar13 = uVar13 + uVar20;
        uVar19 = uVar19 + 1;
      } while (width - 1 != uVar19);
    }
  }
  if (width % 3 == 1) {
    iVar5 = (int)diff[(long)width + -1];
    lVar10 = (long)iVar5;
    lVar22 = lVar22 + lVar10;
    uVar19 = (ulong)(uint)(iVar5 * iVar5);
    lVar23 = lVar23 + uVar19;
    if (1 < height) {
      psVar7 = diff + (long)width + -1;
      uVar11 = 0;
      do {
        sVar2 = *psVar7;
        sVar3 = psVar7[lVar18];
        uVar17 = (ulong)sVar3;
        psVar7 = psVar7 + lVar18;
        lVar25 = lVar25 + (long)sVar2 * uVar17;
        lVar10 = lVar10 + uVar17;
        uVar14 = (ulong)(uint)((int)sVar3 * (int)sVar3);
        uVar19 = uVar19 + uVar14;
        uVar1 = uVar11 + 1;
        if ((long)(int)(((iVar9 == 1) - 3) + height) <= (long)uVar11) {
          uVar17 = 0;
          uVar14 = 0;
        }
        lVar23 = lVar23 + uVar14;
        lVar22 = lVar22 + uVar17;
        uVar11 = uVar1;
      } while (height - 1 != uVar1);
    }
  }
  else {
    iVar5 = (int)diff[(long)width + -2];
    sVar2 = diff[(long)width + -1];
    lVar10 = (long)sVar2;
    lVar22 = lVar22 + (iVar5 + sVar2);
    uVar20 = (int)sVar2 * (int)sVar2;
    uVar19 = (ulong)uVar20;
    lVar23 = lVar23 + (ulong)(iVar5 * iVar5 + uVar20);
    if (1 < height) {
      psVar7 = diff + (long)width + -1;
      uVar11 = 0;
      do {
        iVar5 = (int)psVar7[lVar18 + -1];
        if (iVar9 == 1 || uVar11 < height - 2) {
          lVar4 = lVar4 + (int)psVar7[-1] * (int)*psVar7;
          lVar25 = lVar25 + psVar7[-1] * iVar5;
        }
        sVar2 = psVar7[lVar18];
        uVar20 = (int)sVar2 * (int)sVar2;
        if ((long)uVar11 < (long)(int)(((iVar9 == 1) - 3) + height)) {
          lVar22 = lVar22 + (sVar2 + iVar5);
          lVar23 = lVar23 + (ulong)(iVar5 * iVar5 + uVar20);
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + sVar2;
        uVar19 = uVar19 + uVar20;
        lVar25 = lVar25 + (int)*psVar7 * (int)sVar2;
        psVar7 = psVar7 + lVar18;
      } while (height - 1 != uVar11);
    }
  }
  if (width < 1) {
    lVar16 = 0;
    lVar24 = 0;
  }
  else {
    uVar11 = 0;
    lVar24 = 0;
    lVar16 = 0;
    do {
      iVar9 = (int)diff[uVar11];
      lVar24 = lVar24 + iVar9;
      lVar16 = lVar16 + (ulong)(uint)(iVar9 * iVar9);
      uVar11 = uVar11 + 1;
    } while ((uint)width != uVar11);
  }
  if (height < 1) {
    lVar8 = 0;
    lVar12 = 0;
  }
  else {
    uVar11 = (ulong)(uint)height;
    lVar12 = 0;
    lVar8 = 0;
    do {
      iVar9 = (int)*diff;
      lVar8 = lVar8 + iVar9;
      lVar12 = lVar12 + (ulong)(uint)(iVar9 * iVar9);
      diff = diff + lVar18;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  lVar10 = lVar22 - lVar10;
  fVar31 = (float)((width + -1) * height);
  lVar21 = lVar22 - lVar21;
  fVar42 = (float)((height + -1) * width);
  fVar27 = (float)(long)(lVar23 - uVar19) - (float)(lVar10 * lVar10) / fVar31;
  fVar44 = (float)(long)(lVar23 - uVar13) - (float)(lVar21 * lVar21) / fVar42;
  fVar38 = 1.0;
  if (0.0 < fVar27) {
    lVar8 = lVar22 - lVar8;
    fVar34 = (float)(lVar23 - lVar12) - (float)(lVar8 * lVar8) / fVar31;
    fVar38 = 1.0;
    if (0.0 < fVar34) {
      fVar27 = fVar27 * fVar34;
      if (fVar27 < 0.0) {
        fVar27 = sqrtf(fVar27);
      }
      else {
        fVar27 = SQRT(fVar27);
      }
      fVar27 = ((float)lVar4 - (float)(lVar8 * lVar10) / fVar31) / fVar27;
      fVar38 = 0.0;
      if (0.0 <= fVar27) {
        fVar38 = fVar27;
      }
    }
  }
  *hcorr = fVar38;
  fVar38 = 1.0;
  if (0.0 < fVar44) {
    lVar22 = lVar22 - lVar24;
    fVar27 = (float)(lVar23 - lVar16) - (float)(lVar22 * lVar22) / fVar42;
    if (0.0 < fVar27) {
      fVar44 = fVar44 * fVar27;
      if (fVar44 < 0.0) {
        fVar44 = sqrtf(fVar44);
      }
      else {
        fVar44 = SQRT(fVar44);
      }
      fVar44 = ((float)lVar25 - (float)(lVar22 * lVar21) / fVar42) / fVar44;
      fVar38 = 0.0;
      if (0.0 <= fVar44) {
        fVar38 = fVar44;
      }
    }
  }
  *vcorr = fVar38;
  return;
}

Assistant:

void av1_get_horver_correlation_full_sse4_1(const int16_t *diff, int stride,
                                            int width, int height, float *hcorr,
                                            float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - right neighbour pixel
  // z - below neighbour pixel
  // w - down-right neighbour pixel
  int64_t xy_sum = 0, xz_sum = 0;
  int64_t x_sum = 0, x2_sum = 0;

  // Process horizontal and vertical correlations through the body in 4x4
  // blocks.  This excludes the final row and column and possibly one extra
  // column depending how 3 divides into width and height
  int32_t xy_tmp[4] = { 0 }, xz_tmp[4] = { 0 };
  int32_t x_tmp[4] = { 0 }, x2_tmp[4] = { 0 };
  __m128i xy_sum_32 = _mm_setzero_si128();
  __m128i xz_sum_32 = _mm_setzero_si128();
  __m128i x_sum_32 = _mm_setzero_si128();
  __m128i x2_sum_32 = _mm_setzero_si128();
  for (int i = 0; i <= height - 4; i += 3) {
    for (int j = 0; j <= width - 4; j += 3) {
      horver_correlation_4x4(&diff[i * stride + j], stride, &xy_sum_32,
                             &xz_sum_32, &x_sum_32, &x2_sum_32);
    }
    xx_storeu_128(xy_tmp, xy_sum_32);
    xx_storeu_128(xz_tmp, xz_sum_32);
    xx_storeu_128(x_tmp, x_sum_32);
    xx_storeu_128(x2_tmp, x2_sum_32);
    xy_sum += (int64_t)xy_tmp[3] + xy_tmp[2] + xy_tmp[1];
    xz_sum += (int64_t)xz_tmp[3] + xz_tmp[2] + xz_tmp[0];
    x_sum += (int64_t)x_tmp[3] + x_tmp[2] + x_tmp[1] + x_tmp[0];
    x2_sum += (int64_t)x2_tmp[2] + x2_tmp[1] + x2_tmp[0];
    xy_sum_32 = _mm_setzero_si128();
    xz_sum_32 = _mm_setzero_si128();
    x_sum_32 = _mm_setzero_si128();
    x2_sum_32 = _mm_setzero_si128();
  }

  // x_sum now covers every pixel except the final 1-2 rows and 1-2 cols
  int64_t x_finalrow = 0, x_finalcol = 0, x2_finalrow = 0, x2_finalcol = 0;

  // Do we have 2 rows remaining or just the one?  Note that width and height
  // are powers of 2, so each modulo 3 must be 1 or 2.
  if (height % 3 == 1) {  // Just horiz corrs on the final row
    const int16_t x0 = diff[(height - 1) * stride];
    x_sum += x0;
    x_finalrow += x0;
    x2_sum += x0 * x0;
    x2_finalrow += x0 * x0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 1) * stride + j];
      const int16_t y = diff[(height - 1) * stride + j + 1];
      xy_sum += x * y;
      x_sum += y;
      x2_sum += y * y;
      x_finalrow += y;
      x2_finalrow += y * y;
    }
  } else {  // Two rows remaining to do
    const int16_t x0 = diff[(height - 2) * stride];
    const int16_t z0 = diff[(height - 1) * stride];
    x_sum += x0 + z0;
    x2_sum += x0 * x0 + z0 * z0;
    x_finalrow += z0;
    x2_finalrow += z0 * z0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 2) * stride + j];
      const int16_t y = diff[(height - 2) * stride + j + 1];
      const int16_t z = diff[(height - 1) * stride + j];
      const int16_t w = diff[(height - 1) * stride + j + 1];

      // Horizontal and vertical correlations for the penultimate row:
      xy_sum += x * y;
      xz_sum += x * z;

      // Now just horizontal correlations for the final row:
      xy_sum += z * w;

      x_sum += y + w;
      x2_sum += y * y + w * w;
      x_finalrow += w;
      x2_finalrow += w * w;
    }
  }

  // Do we have 2 columns remaining or just the one?
  if (width % 3 == 1) {  // Just vert corrs on the final col
    const int16_t x0 = diff[width - 1];
    x_sum += x0;
    x_finalcol += x0;
    x2_sum += x0 * x0;
    x2_finalcol += x0 * x0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 1];
      xz_sum += x * z;
      x_finalcol += z;
      x2_finalcol += z * z;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z;
        x2_sum += z * z;
      }
    }
  } else {  // Two cols remaining
    const int16_t x0 = diff[width - 2];
    const int16_t y0 = diff[width - 1];
    x_sum += x0 + y0;
    x2_sum += x0 * x0 + y0 * y0;
    x_finalcol += y0;
    x2_finalcol += y0 * y0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 2];
      const int16_t y = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 2];
      const int16_t w = diff[(i + 1) * stride + width - 1];

      // Horizontal and vertical correlations for the penultimate col:
      // Skip these on the last iteration of this loop if we also had two
      // rows remaining, otherwise the final horizontal and vertical correlation
      // get erroneously processed twice
      if (i < height - 2 || height % 3 == 1) {
        xy_sum += x * y;
        xz_sum += x * z;
      }

      x_finalcol += w;
      x2_finalcol += w * w;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z + w;
        x2_sum += z * z + w * w;
      }

      // Now just vertical correlations for the final column:
      xz_sum += y * w;
    }
  }

  // Calculate the simple sums and squared-sums
  int64_t x_firstrow = 0, x_firstcol = 0;
  int64_t x2_firstrow = 0, x2_firstcol = 0;

  for (int j = 0; j < width; ++j) {
    x_firstrow += diff[j];
    x2_firstrow += diff[j] * diff[j];
  }
  for (int i = 0; i < height; ++i) {
    x_firstcol += diff[i * stride];
    x2_firstcol += diff[i * stride] * diff[i * stride];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}